

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall vkt::shaderexecutor::Functions::PreciseFunc1::~PreciseFunc1(PreciseFunc1 *this)

{
  PreciseFunc1 *this_local;
  
  ~PreciseFunc1(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

PreciseFunc1	(const string& name, DoubleFunc1& func) : CFloatFunc1(name, func) {}